

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O0

int Fra_SmlNodesCompareInFrame
              (Fra_Sml_t *p,Aig_Obj_t *pObj0,Aig_Obj_t *pObj1,int iFrame0,int iFrame1)

{
  int iVar1;
  uint *puVar2;
  uint *puVar3;
  int local_44;
  int i;
  uint *pSims1;
  uint *pSims0;
  int iFrame1_local;
  int iFrame0_local;
  Aig_Obj_t *pObj1_local;
  Aig_Obj_t *pObj0_local;
  Fra_Sml_t *p_local;
  
  iVar1 = Aig_IsComplement(pObj0);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                  ,0x22a,
                  "int Fra_SmlNodesCompareInFrame(Fra_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)")
    ;
  }
  iVar1 = Aig_IsComplement(pObj1);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                  ,0x22b,
                  "int Fra_SmlNodesCompareInFrame(Fra_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)")
    ;
  }
  if ((iFrame0 != 0) && (p->nWordsTotal <= p->nWordsFrame)) {
    __assert_fail("iFrame0 == 0 || p->nWordsFrame < p->nWordsTotal",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                  ,0x22c,
                  "int Fra_SmlNodesCompareInFrame(Fra_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)")
    ;
  }
  if ((iFrame1 != 0) && (p->nWordsTotal <= p->nWordsFrame)) {
    __assert_fail("iFrame1 == 0 || p->nWordsFrame < p->nWordsTotal",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                  ,0x22d,
                  "int Fra_SmlNodesCompareInFrame(Fra_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)")
    ;
  }
  puVar2 = Fra_ObjSim(p,pObj0->Id);
  iVar1 = p->nWordsFrame;
  puVar3 = Fra_ObjSim(p,pObj1->Id);
  local_44 = 0;
  while( true ) {
    if (p->nWordsFrame <= local_44) {
      return 1;
    }
    if (puVar2[(long)(iVar1 * iFrame0) + (long)local_44] !=
        puVar3[(long)(p->nWordsFrame * iFrame1) + (long)local_44]) break;
    local_44 = local_44 + 1;
  }
  return 0;
}

Assistant:

int Fra_SmlNodesCompareInFrame( Fra_Sml_t * p, Aig_Obj_t * pObj0, Aig_Obj_t * pObj1, int iFrame0, int iFrame1 )
{
    unsigned * pSims0, * pSims1;
    int i;
    assert( !Aig_IsComplement(pObj0) );
    assert( !Aig_IsComplement(pObj1) );
    assert( iFrame0 == 0 || p->nWordsFrame < p->nWordsTotal );
    assert( iFrame1 == 0 || p->nWordsFrame < p->nWordsTotal );
    // get hold of the simulation information
    pSims0  = Fra_ObjSim(p, pObj0->Id) + p->nWordsFrame * iFrame0;
    pSims1  = Fra_ObjSim(p, pObj1->Id) + p->nWordsFrame * iFrame1;
    // compare
    for ( i = 0; i < p->nWordsFrame; i++ )
        if ( pSims0[i] != pSims1[i] )
            return 0;
    return 1;
}